

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O3

int BUFFER_unbuild(BUFFER_HANDLE handle)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  BUFFER *b;
  
  if (handle == (BUFFER_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x145;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/buffer.c"
                ,"BUFFER_unbuild",0x144,1,"Failure: handle is invalid.");
    }
  }
  else {
    iVar2 = 0;
    if (handle->buffer != (uchar *)0x0) {
      free(handle->buffer);
      handle->buffer = (uchar *)0x0;
      handle->size = 0;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

extern int BUFFER_unbuild(BUFFER_HANDLE handle)
{
    int result;
    if (handle == NULL)
    {
        /* Codes_SRS_BUFFER_07_014: [BUFFER_unbuild shall return a nonzero value if BUFFER_HANDLE is NULL.] */
        LogError("Failure: handle is invalid.");
        result = MU_FAILURE;
    }
    else
    {
        BUFFER* b = (BUFFER*)handle;
        if (b->buffer != NULL)
        {
            free(b->buffer);
            b->buffer = NULL;
            b->size = 0;
        
        }

        /* Codes_SRS_BUFFER_07_015: [BUFFER_unbuild shall always return success if the unsigned char* referenced by BUFFER_HANDLE is NULL.] */
        result = 0;
    }
    return result;
}